

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_validate(JSON_Value *schema,JSON_Value *value)

{
  JSON_Value_Type JVar1;
  JSON_Value_Type JVar2;
  JSON_Status JVar3;
  JSON_Array *array;
  JSON_Array *array_00;
  size_t sVar4;
  JSON_Value *pJVar5;
  JSON_Value *pJVar6;
  JSON_Object *object;
  JSON_Object *object_00;
  size_t sVar7;
  char *name;
  size_t count;
  size_t i;
  char *key;
  JSON_Value_Type value_type;
  JSON_Value_Type schema_type;
  JSON_Object *value_object;
  JSON_Object *schema_object;
  JSON_Array *value_array;
  JSON_Array *schema_array;
  JSON_Value *temp_value;
  JSON_Value *temp_schema_value;
  JSON_Value *value_local;
  JSON_Value *schema_local;
  
  if ((schema == (JSON_Value *)0x0) || (value == (JSON_Value *)0x0)) {
    schema_local._4_4_ = -1;
  }
  else {
    JVar1 = json_value_get_type(schema);
    JVar2 = json_value_get_type(value);
    if ((JVar1 == JVar2) || (JVar1 == 1)) {
      switch(JVar1) {
      case 1:
      case 2:
      case 3:
      case 6:
        schema_local._4_4_ = 0;
        break;
      case 4:
        object = json_value_get_object(schema);
        object_00 = json_value_get_object(value);
        sVar4 = json_object_get_count(object);
        if (sVar4 == 0) {
          schema_local._4_4_ = 0;
        }
        else {
          sVar7 = json_object_get_count(object_00);
          if (sVar7 < sVar4) {
            schema_local._4_4_ = -1;
          }
          else {
            for (count = 0; count < sVar4; count = count + 1) {
              name = json_object_get_name(object,count);
              pJVar5 = json_object_get_value(object,name);
              pJVar6 = json_object_get_value(object_00,name);
              if (pJVar6 == (JSON_Value *)0x0) {
                return -1;
              }
              JVar3 = json_validate(pJVar5,pJVar6);
              if (JVar3 != 0) {
                return -1;
              }
            }
            schema_local._4_4_ = 0;
          }
        }
        break;
      case 5:
        array = json_value_get_array(schema);
        array_00 = json_value_get_array(value);
        sVar4 = json_array_get_count(array);
        if (sVar4 == 0) {
          schema_local._4_4_ = 0;
        }
        else {
          pJVar5 = json_array_get_value(array,0);
          for (count = 0; sVar4 = json_array_get_count(array_00), count < sVar4; count = count + 1)
          {
            pJVar6 = json_array_get_value(array_00,count);
            JVar3 = json_validate(pJVar5,pJVar6);
            if (JVar3 != 0) {
              return -1;
            }
          }
          schema_local._4_4_ = 0;
        }
        break;
      case -1:
      default:
        schema_local._4_4_ = -1;
      }
    }
    else {
      schema_local._4_4_ = -1;
    }
  }
  return schema_local._4_4_;
}

Assistant:

JSON_Status json_validate(const JSON_Value *schema, const JSON_Value *value) {
    JSON_Value *temp_schema_value = NULL, *temp_value = NULL;
    JSON_Array *schema_array = NULL, *value_array = NULL;
    JSON_Object *schema_object = NULL, *value_object = NULL;
    JSON_Value_Type schema_type = JSONError, value_type = JSONError;
    const char *key = NULL;
    size_t i = 0, count = 0;
    if (schema == NULL || value == NULL) {
        return JSONFailure;
    }
    schema_type = json_value_get_type(schema);
    value_type = json_value_get_type(value);
    if (schema_type != value_type && schema_type != JSONNull) { /* null represents all values */
        return JSONFailure;
    }
    switch (schema_type) {
        case JSONArray:
            schema_array = json_value_get_array(schema);
            value_array = json_value_get_array(value);
            count = json_array_get_count(schema_array);
            if (count == 0) {
                return JSONSuccess; /* Empty array allows all types */
            }
            /* Get first value from array, rest is ignored */
            temp_schema_value = json_array_get_value(schema_array, 0);
            for (i = 0; i < json_array_get_count(value_array); i++) {
                temp_value = json_array_get_value(value_array, i);
                if (json_validate(temp_schema_value, temp_value) != JSONSuccess) {
                    return JSONFailure;
                }
            }
            return JSONSuccess;
        case JSONObject:
            schema_object = json_value_get_object(schema);
            value_object = json_value_get_object(value);
            count = json_object_get_count(schema_object);
            if (count == 0) {
                return JSONSuccess; /* Empty object allows all objects */
            } else if (json_object_get_count(value_object) < count) {
                return JSONFailure; /* Tested object mustn't have less name-value pairs than schema */
            }
            for (i = 0; i < count; i++) {
                key = json_object_get_name(schema_object, i);
                temp_schema_value = json_object_get_value(schema_object, key);
                temp_value = json_object_get_value(value_object, key);
                if (temp_value == NULL) {
                    return JSONFailure;
                }
                if (json_validate(temp_schema_value, temp_value) != JSONSuccess) {
                    return JSONFailure;
                }
            }
            return JSONSuccess;
        case JSONString: case JSONNumber: case JSONBoolean: case JSONNull:
            return JSONSuccess; /* equality already tested before switch */
        case JSONError: default:
            return JSONFailure;
    }
}